

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

void bfgs_iter_middle<dense_parameters>
               (vw *all,bfgs *b,float *mem,double *rho,double *alpha,int *lastj,int *origin,
               dense_parameters *weights)

{
  float fVar1;
  double dVar2;
  uint32_t uVar3;
  long lVar4;
  long lVar5;
  uint64_t uVar6;
  weight *pwVar7;
  undefined8 *puVar8;
  byte bVar9;
  int iVar10;
  weight *pwVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  anon_union_4_2_947300a4 x;
  double dVar15;
  double dVar16;
  float fVar17;
  double dVar18;
  
  if (b->m == 0) {
    bVar9 = (byte)weights->_stride_shift;
    pwVar11 = weights->_begin;
    uVar6 = weights->_weight_mask;
    lVar14 = (1L << (bVar9 & 0x3f)) * 4;
    dVar2 = 0.0;
    dVar15 = 0.0;
    for (lVar4 = 0; uVar6 * 4 + 4 != lVar4; lVar4 = lVar4 + lVar14) {
      fVar17 = *(float *)((long)pwVar11 + lVar4 + 4);
      dVar18 = (double)*(float *)((long)pwVar11 + lVar4 + 0xc);
      dVar16 = (double)mem[((ulong)(lVar4 >> 2) >> (bVar9 & 0x3f)) * (long)b->mem_stride +
                           (long)(*origin % b->mem_stride)];
      dVar2 = dVar2 + dVar16 * dVar18 * dVar16;
      dVar15 = dVar15 + dVar18 * (double)fVar17 *
                        (double)(fVar17 - mem[((ulong)(lVar4 >> 2) >> (bVar9 & 0x3f)) *
                                              (long)b->mem_stride + (long)(*origin % b->mem_stride)]
                                );
    }
    fVar17 = (float)(dVar15 / dVar2);
    if ((fVar17 < 0.0) || ((~(uint)fVar17 & 0x7fc00000) == 0)) {
      fVar17 = 0.0;
    }
    pwVar7 = pwVar11;
    for (lVar4 = 0; (weight *)((long)pwVar11 + lVar4) != pwVar7 + uVar6 + 1; lVar4 = lVar4 + lVar14)
    {
      fVar1 = *(float *)((long)pwVar11 + lVar4 + 4);
      mem[((ulong)(lVar4 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * (long)b->mem_stride +
          (long)(*origin % b->mem_stride)] = fVar1;
      *(float *)((long)pwVar11 + lVar4 + 8) =
           *(float *)((long)pwVar11 + lVar4 + 8) * fVar17 -
           fVar1 * *(float *)((long)pwVar11 + lVar4 + 0xc);
      *(undefined4 *)((long)pwVar11 + lVar4 + 4) = 0;
      pwVar7 = weights->_begin;
      uVar6 = weights->_weight_mask;
    }
    if (all->quiet == false) {
      fprintf(_stderr,"%f\t",SUB84((double)fVar17,0));
      return;
    }
  }
  else {
    if (all->quiet == false) {
      fprintf(_stderr,"%-10s\t","");
    }
    pwVar11 = weights->_begin;
    uVar3 = weights->_stride_shift;
    dVar15 = 0.0;
    dVar16 = 0.0;
    dVar2 = 0.0;
    lVar14 = 0;
    pwVar7 = pwVar11;
    while( true ) {
      if ((weight *)((long)pwVar11 + lVar14) == pwVar7 + weights->_weight_mask + 1) break;
      lVar4 = ((ulong)(lVar14 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * (long)b->mem_stride;
      lVar5 = (long)(*origin % b->mem_stride);
      mem[lVar4 + lVar5] = *(float *)((long)pwVar11 + lVar14 + 4) - mem[lVar4 + lVar5];
      lVar5 = (long)((*origin + 1) % b->mem_stride);
      mem[lVar4 + lVar5] = *(float *)((long)pwVar11 + lVar14) - mem[lVar4 + lVar5];
      fVar17 = *(float *)((long)pwVar11 + lVar14 + 4);
      *(float *)((long)pwVar11 + lVar14 + 8) = fVar17;
      dVar18 = (double)mem[lVar4 + *origin % b->mem_stride];
      dVar15 = dVar15 + dVar18 * dVar18 * (double)*(float *)((long)pwVar11 + lVar14 + 0xc);
      dVar16 = dVar16 + dVar18 * (double)mem[lVar4 + (*origin + 1) % b->mem_stride];
      dVar2 = dVar2 + (double)mem[lVar4 + (*origin + 1) % b->mem_stride] * (double)fVar17;
      pwVar7 = weights->_begin;
      lVar14 = lVar14 + (1L << ((byte)uVar3 & 0x3f)) * 4;
    }
    if ((dVar16 <= 0.0) || (dVar15 <= 0.0)) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = &PTR__exception_002af518;
      __cxa_throw(puVar8,&curv_exception::typeinfo,std::exception::~exception);
    }
    *rho = 1.0 / dVar16;
    for (lVar14 = 0; lVar4 = (long)*lastj, lVar14 < lVar4; lVar14 = lVar14 + 1) {
      alpha[lVar14] = dVar2 * rho[lVar14];
      uVar3 = weights->_stride_shift;
      pwVar11 = weights->_begin;
      dVar2 = 0.0;
      pwVar7 = pwVar11;
      for (lVar4 = 0; (weight *)((long)pwVar11 + lVar4) != pwVar7 + weights->_weight_mask + 1;
          lVar4 = lVar4 + (1L << ((byte)uVar3 & 0x3f)) * 4) {
        lVar5 = ((ulong)(lVar4 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * (long)b->mem_stride
        ;
        fVar17 = *(float *)((long)pwVar11 + lVar4 + 8) -
                 (float)alpha[lVar14] * mem[lVar5 + (*origin + (int)lVar14 * 2) % b->mem_stride];
        *(float *)((long)pwVar11 + lVar4 + 8) = fVar17;
        dVar2 = dVar2 + (double)fVar17 *
                        (double)mem[lVar5 + (*origin + (int)lVar14 * 2 + 3) % b->mem_stride];
        pwVar7 = weights->_begin;
      }
    }
    alpha[lVar4] = dVar2 * rho[lVar4];
    pwVar11 = weights->_begin;
    uVar3 = weights->_stride_shift;
    dVar2 = 0.0;
    pwVar7 = pwVar11;
    for (lVar14 = 0; uVar6 = weights->_weight_mask,
        (weight *)((long)pwVar11 + lVar14) != pwVar7 + uVar6 + 1;
        lVar14 = lVar14 + (1L << ((byte)uVar3 & 0x3f)) * 4) {
      lVar4 = ((ulong)(lVar14 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * (long)b->mem_stride;
      fVar17 = *(float *)((long)pwVar11 + lVar14 + 0xc) * (float)(dVar16 / dVar15) *
               (*(float *)((long)pwVar11 + lVar14 + 8) -
               (float)alpha[*lastj] * mem[lVar4 + (*lastj * 2 + *origin) % b->mem_stride]);
      *(float *)((long)pwVar11 + lVar14 + 8) = fVar17;
      dVar2 = dVar2 + (double)fVar17 * (double)mem[lVar4 + (*lastj * 2 + *origin) % b->mem_stride];
      pwVar7 = weights->_begin;
    }
    for (uVar13 = (ulong)(uint)*lastj; iVar12 = (int)uVar13, 0 < iVar12; uVar13 = uVar13 - 1) {
      dVar16 = dVar2 * rho[uVar13];
      dVar15 = alpha[uVar13];
      uVar3 = weights->_stride_shift;
      dVar2 = 0.0;
      pwVar11 = pwVar7;
      for (lVar14 = 0; (weight *)((long)pwVar7 + lVar14) != pwVar11 + uVar6 + 1;
          lVar14 = lVar14 + (1L << ((byte)uVar3 & 0x3f)) * 4) {
        lVar4 = ((ulong)(lVar14 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) *
                (long)b->mem_stride;
        fVar17 = mem[lVar4 + (*origin + iVar12 * 2 + 1) % b->mem_stride] * (float)(dVar15 - dVar16)
                 + *(float *)((long)pwVar7 + lVar14 + 8);
        *(float *)((long)pwVar7 + lVar14 + 8) = fVar17;
        dVar2 = dVar2 + (double)fVar17 *
                        (double)mem[lVar4 + (*origin + iVar12 * 2 + -2) % b->mem_stride];
        pwVar11 = weights->_begin;
        uVar6 = weights->_weight_mask;
      }
      pwVar7 = pwVar11;
    }
    dVar15 = *rho;
    dVar16 = *alpha;
    uVar3 = weights->_stride_shift;
    pwVar11 = pwVar7;
    for (lVar14 = 0; (weight *)((long)pwVar7 + lVar14) != pwVar11 + uVar6 + 1;
        lVar14 = lVar14 + (1L << ((byte)uVar3 & 0x3f)) * 4) {
      *(float *)((long)pwVar7 + lVar14 + 8) =
           mem[((ulong)(lVar14 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * (long)b->mem_stride
               + (long)((*origin + 1) % b->mem_stride)] * -(float)(dVar16 - dVar2 * dVar15) -
           *(float *)((long)pwVar7 + lVar14 + 8);
      pwVar11 = weights->_begin;
      uVar6 = weights->_weight_mask;
    }
    iVar10 = b->m + -1;
    iVar12 = *lastj + 1;
    if (iVar10 <= *lastj) {
      iVar12 = iVar10;
    }
    *lastj = iVar12;
    *origin = (*origin + b->mem_stride + -2) % b->mem_stride;
    uVar3 = weights->_stride_shift;
    pwVar11 = weights->_begin;
    pwVar7 = pwVar11;
    for (lVar14 = 0; (weight *)((long)pwVar11 + lVar14) != pwVar7 + weights->_weight_mask + 1;
        lVar14 = lVar14 + (1L << ((byte)uVar3 & 0x3f)) * 4) {
      lVar4 = ((ulong)(lVar14 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * (long)b->mem_stride;
      mem[lVar4 + *origin % b->mem_stride] = *(float *)((long)pwVar11 + lVar14 + 4);
      mem[lVar4 + (*origin + 1) % b->mem_stride] = *(float *)((long)pwVar11 + lVar14);
      *(undefined4 *)((long)pwVar11 + lVar14 + 4) = 0;
      pwVar7 = weights->_begin;
    }
    for (uVar13 = (ulong)(uint)*lastj; 0 < (int)uVar13; uVar13 = uVar13 - 1) {
      rho[uVar13] = rho[uVar13 - 1];
    }
  }
  return;
}

Assistant:

void bfgs_iter_middle(vw& all, bfgs& b, float* mem, double* rho, double* alpha, int& lastj, int& origin, T& weights)
{
  float* mem0 = mem;
  uint32_t length = 1 << all.num_bits;
  // implement conjugate gradient
  if (b.m == 0)
  {
    double g_Hy = 0.;
    double g_Hg = 0.;
    double y = 0.;

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      y = (&(*w))[W_GT] - mem[(MEM_GT + origin) % b.mem_stride];
      g_Hy += ((double)(&(*w))[W_GT]) * ((&(*w))[W_COND]) * y;
      g_Hg +=
          ((double)mem[(MEM_GT + origin) % b.mem_stride]) * ((&(*w))[W_COND]) * mem[(MEM_GT + origin) % b.mem_stride];
    }

    float beta = (float)(g_Hy / g_Hg);

    if (beta < 0.f || nanpattern(beta))
      beta = 0.f;

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      mem[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];

      (&(*w))[W_DIR] *= beta;
      (&(*w))[W_DIR] -= ((&(*w))[W_COND]) * ((&(*w))[W_GT]);
      (&(*w))[W_GT] = 0;
    }
    if (!all.quiet)
      fprintf(stderr, "%f\t", beta);
    return;

    mem = mem0 + (length - 1) * b.mem_stride;
  }
  else
  {
    if (!all.quiet)
      fprintf(stderr, "%-10s\t", "");
  }

  // implement bfgs
  double y_s = 0.;
  double y_Hy = 0.;
  double s_q = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    mem1[(MEM_YT + origin) % b.mem_stride] = (&(*w))[W_GT] - mem1[(MEM_GT + origin) % b.mem_stride];
    mem1[(MEM_ST + origin) % b.mem_stride] = (&(*w))[W_XT] - mem1[(MEM_XT + origin) % b.mem_stride];
    (&(*w))[W_DIR] = (&(*w))[W_GT];
    y_s += ((double)mem1[(MEM_YT + origin) % b.mem_stride]) * mem1[(MEM_ST + origin) % b.mem_stride];
    y_Hy +=
        ((double)mem1[(MEM_YT + origin) % b.mem_stride]) * mem1[(MEM_YT + origin) % b.mem_stride] * ((&(*w))[W_COND]);
    s_q += ((double)mem1[(MEM_ST + origin) % b.mem_stride]) * ((&(*w))[W_GT]);
  }

  if (y_s <= 0. || y_Hy <= 0.)
    throw curv_ex;
  rho[0] = 1 / y_s;

  float gamma = (float)(y_s / y_Hy);

  for (int j = 0; j < lastj; j++)
  {
    alpha[j] = rho[j] * s_q;
    s_q = 0.;
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      (&(*w))[W_DIR] -= (float)alpha[j] * mem[(2 * j + MEM_YT + origin) % b.mem_stride];
      s_q += ((double)mem[(2 * j + 2 + MEM_ST + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    }
  }

  alpha[lastj] = rho[lastj] * s_q;
  double y_r = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    (&(*w))[W_DIR] -= (float)alpha[lastj] * mem[(2 * lastj + MEM_YT + origin) % b.mem_stride];
    (&(*w))[W_DIR] *= gamma * ((&(*w))[W_COND]);
    y_r += ((double)mem[(2 * lastj + MEM_YT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
  }

  double coef_j;

  for (int j = lastj; j > 0; j--)
  {
    coef_j = alpha[j] - rho[j] * y_r;
    y_r = 0.;
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      (&(*w))[W_DIR] += (float)coef_j * mem[(2 * j + MEM_ST + origin) % b.mem_stride];
      y_r += ((double)mem[(2 * j - 2 + MEM_YT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    }
  }

  coef_j = alpha[0] - rho[0] * y_r;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    (&(*w))[W_DIR] = -(&(*w))[W_DIR] - (float)coef_j * mem[(MEM_ST + origin) % b.mem_stride];
  }

  /*********************
  ** shift
  ********************/

  lastj = (lastj < b.m - 1) ? lastj + 1 : b.m - 1;
  origin = (origin + b.mem_stride - 2) % b.mem_stride;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    mem[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];
    mem[(MEM_XT + origin) % b.mem_stride] = (&(*w))[W_XT];
    (&(*w))[W_GT] = 0;
  }
  for (int j = lastj; j > 0; j--) rho[j] = rho[j - 1];
}